

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DUI.h
# Opt level: O1

_Bool DUI_Checkbox(char *text,_Bool *checked)

{
  bool bVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  _Bool _Var5;
  size_t sVar6;
  uint8_t *puVar7;
  SDL_Rect bounds;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  
  sVar6 = strlen(text);
  _Var5 = _duiClicked;
  local_40 = ((int)sVar6 + 2) * _duiStyle.CharSize + _duiStyle.ButtonPadding * 2;
  local_3c = _duiStyle.CharSize + _duiStyle.ButtonPadding * 2;
  local_48 = _duiCursor.x;
  local_44 = _duiCursor.y;
  bVar1 = false;
  if ((_duiCursor.x <= _duiMouse.x) && (bVar1 = false, _duiMouse.x < _duiCursor.x + local_40)) {
    if (_duiMouse.y < _duiCursor.y) {
      bVar1 = false;
    }
    else {
      bVar1 = _duiMouse.y < _duiCursor.y + local_3c;
    }
  }
  puVar7 = _duiStyle.ColorDefault;
  puVar2 = _duiStyle.ColorDefault;
  puVar3 = _duiStyle.ColorDefault;
  puVar4 = _duiStyle.ColorDefault;
  if (bVar1) {
    puVar4 = _duiStyle.ColorHover;
    puVar3 = _duiStyle.ColorHover;
  }
  if (bVar1) {
    puVar2 = _duiStyle.ColorHover;
  }
  if (bVar1) {
    puVar7 = _duiStyle.ColorHover;
  }
  SDL_SetRenderDrawColor(_duiRenderer,*puVar7,puVar2[1],puVar3[2],puVar4[3]);
  SDL_RenderFillRect(_duiRenderer,&local_48);
  SDL_SetRenderDrawColor
            (_duiRenderer,_duiStyle.ColorBorder[0],_duiStyle.ColorBorder[1],_duiStyle.ColorBorder[2]
             ,_duiStyle.ColorBorder[3]);
  SDL_RenderDrawRect(_duiRenderer,&local_48);
  local_38 = local_48 + _duiStyle.CharSize;
  iStack_34 = _duiStyle.CharSize / 2 + local_44;
  iStack_30 = _duiStyle.CharSize;
  iStack_2c = _duiStyle.CharSize;
  SDL_RenderDrawRect(_duiRenderer);
  if ((bVar1) && ((_Var5 & 1U) != 0)) {
    *checked = (_Bool)(*checked ^ 1);
  }
  if (*checked == true) {
    local_38 = local_38 + 1;
    iStack_34 = iStack_34 + 1;
    iStack_30 = iStack_30 + -2;
    iStack_2c = iStack_2c + -2;
    SDL_RenderFillRect(_duiRenderer);
  }
  _duiCursor.x = _duiCursor.x + _duiStyle.ButtonPadding + _duiStyle.CharSize * 2;
  _duiCursor.y = _duiCursor.y + _duiStyle.ButtonPadding;
  DUI_Print("%s",text);
  _duiCursor.x = local_40 + local_48 + _duiStyle.ButtonMargin;
  _duiCursor.y = local_44;
  return *checked;
}

Assistant:

bool DUI_Checkbox(const char * text, bool * checked)
{
    int width = (strlen(text) * _duiStyle.CharSize) 
        + (_duiStyle.CharSize * 2)
        + (_duiStyle.ButtonPadding * 2);

    int height = _duiStyle.CharSize 
        + (_duiStyle.ButtonPadding * 2);

    SDL_Rect bounds = {
        .x = _duiCursor.x,
        .y = _duiCursor.y,
        .w = width,
        .h = height,
    };

    bool hover = SDL_PointInRect(&_duiMouse, &bounds);
    bool clicked = (hover && _duiClicked);

    if (hover) {
        DUI_setColorHover();
    }
    else {
        DUI_setColorDefault();
    }

    SDL_RenderFillRect(_duiRenderer, &bounds);

    DUI_setColorBorder();
    SDL_RenderDrawRect(_duiRenderer, &bounds);

    SDL_Rect mark = { 
        .x = bounds.x + _duiStyle.CharSize,
        .y = bounds.y + (_duiStyle.CharSize / 2),
        .w = _duiStyle.CharSize,
        .h = _duiStyle.CharSize,
    };

    SDL_RenderDrawRect(_duiRenderer, &mark);

    if (clicked) {
        *checked ^= true;
    }

    if (*checked) {
        ++mark.x;
        ++mark.y;
        mark.w -= 2;
        mark.h -= 2;

        SDL_RenderFillRect(_duiRenderer, &mark);
    }

    _duiCursor.x += _duiStyle.ButtonPadding + (_duiStyle.CharSize * 2);
    _duiCursor.y += _duiStyle.ButtonPadding;

    DUI_Print("%s", text);

    _duiCursor.x = bounds.x + bounds.w + _duiStyle.ButtonMargin;
    _duiCursor.y = bounds.y;

    return *checked;
}